

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int libssh2_channel_process_startup
              (LIBSSH2_CHANNEL *channel,char *req,uint req_len,char *msg,uint msg_len)

{
  LIBSSH2_SESSION *session;
  int iVar1;
  time_t start_time;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  start_time = time((time_t *)0x0);
  while( true ) {
    iVar1 = _libssh2_channel_process_startup(channel,req,(ulong)req_len,msg,(ulong)msg_len);
    if (iVar1 != -0x25) {
      return iVar1;
    }
    session = channel->session;
    if ((session == (LIBSSH2_SESSION *)0x0) || (session->api_block_mode == 0)) break;
    iVar1 = _libssh2_wait_socket(session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return -0x25;
}

Assistant:

LIBSSH2_API int
libssh2_channel_process_startup(LIBSSH2_CHANNEL *channel,
                                const char *req, unsigned int req_len,
                                const char *msg, unsigned int msg_len)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 _libssh2_channel_process_startup(channel, req, req_len,
                                                  msg, msg_len));
    return rc;
}